

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priorbox.cpp
# Opt level: O2

int __thiscall
ncnn::PriorBox::forward
          (PriorBox *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  int iVar2;
  pointer pMVar3;
  Mat *pMVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  undefined1 (*pauVar13) [16];
  ulong uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  float *pfVar18;
  ulong uVar19;
  int j;
  uint uVar20;
  int p;
  ulong uVar21;
  long lVar22;
  int p_1;
  int iVar23;
  uint uVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 in_XMM4 [16];
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  undefined1 auVar36 [16];
  float fVar37;
  undefined1 in_XMM15 [16];
  undefined1 auVar38 [16];
  float local_70;
  float local_6c;
  
  pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar1 = pMVar3->w;
  uVar16 = pMVar3->h;
  uVar14 = (ulong)uVar16;
  iVar23 = this->image_width;
  iVar12 = this->image_height;
  if ((iVar12 == -0xe9 && iVar23 == -0xe9) &&
      (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pMVar3 == 0x48) {
    if (((this->max_sizes).data == (void *)0x0) ||
       ((long)(this->max_sizes).c * (this->max_sizes).cstep == 0)) {
      fVar25 = this->step_width;
      fVar28 = this->step_height;
      uVar17 = (this->min_sizes).w;
      iVar12 = (this->aspect_ratios).w;
      iVar23 = uVar17 + iVar12 + -1;
      pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar4,uVar1 * uVar16 * iVar23 * 4,4,opt->blob_allocator);
      pvVar5 = pMVar4->data;
      if (pvVar5 == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar4->c * pMVar4->cstep == 0) {
        return -100;
      }
      fVar26 = 1.0 / (float)(int)uVar1;
      uVar24 = -(uint)(fVar25 == -233.0);
      fVar25 = (float)(~uVar24 & (uint)fVar25 | uVar24 & (uint)fVar26);
      uVar24 = -(uint)(fVar28 == -233.0);
      fVar29 = (float)(int)uVar16 * 0.5;
      uVar11 = 0;
      uVar19 = (ulong)uVar17;
      if ((int)uVar17 < 1) {
        uVar19 = uVar11;
      }
      uVar17 = uVar1;
      if ((int)uVar1 < 1) {
        uVar17 = 0;
      }
      if ((int)uVar16 < 1) {
        uVar14 = uVar11;
      }
      for (; uVar11 != uVar14; uVar11 = uVar11 + 1) {
        pauVar13 = (undefined1 (*) [16])
                   ((long)pvVar5 + (long)(int)(iVar23 * uVar1 * 4 * (int)uVar11) * 4);
        fVar31 = this->offset * fVar25;
        fVar30 = ((float)(int)uVar11 + this->offset) *
                 (float)(~uVar24 & (uint)fVar28 | (uint)(1.0 / (float)(int)uVar16) & uVar24);
        pfVar18 = (float *)(this->min_sizes).data;
        for (uVar20 = 0; uVar20 != uVar17; uVar20 = uVar20 + 1) {
          pvVar6 = (this->min_sizes).data;
          for (uVar21 = 0; uVar19 != uVar21; uVar21 = uVar21 + 1) {
            fVar33 = *(float *)((long)pvVar6 + uVar21 * 4);
            fVar34 = fVar29 * fVar33 * fVar26;
            fVar33 = fVar33 * 0.5;
            in_XMM15._4_4_ = fVar30 - fVar33;
            in_XMM15._0_4_ = fVar31 - fVar34;
            in_XMM15._8_4_ = fVar31 + fVar34;
            in_XMM15._12_4_ = fVar30 + fVar33;
            *pauVar13 = in_XMM15;
            pauVar13 = pauVar13 + 1;
          }
          fVar33 = *pfVar18;
          pvVar6 = (this->aspect_ratios).data;
          for (lVar22 = 1; lVar22 < iVar12; lVar22 = lVar22 + 1) {
            fVar34 = *(float *)((long)pvVar6 + lVar22 * 4);
            auVar38 = rsqrtss(in_XMM15,ZEXT416((uint)fVar34));
            fVar32 = auVar38._0_4_;
            fVar27 = fVar34 * fVar32 * fVar32 + -3.0;
            fVar34 = (float)(~-(uint)(ABS(fVar34) < 1.1754944e-38) &
                            (uint)(fVar34 * fVar32 * -0.5 * fVar27)) * fVar29 * fVar33 * fVar26;
            fVar27 = fVar32 * -0.5 * fVar33 * 0.5 * fVar27;
            in_XMM15._4_4_ = fVar27;
            in_XMM15._0_4_ = fVar34;
            in_XMM15._8_4_ = fVar31;
            in_XMM15._12_4_ = fVar30;
            *(float *)*pauVar13 = fVar31 - fVar34;
            *(float *)((long)*pauVar13 + 4) = fVar30 - fVar27;
            *(float *)((long)*pauVar13 + 8) = fVar31 + fVar34;
            *(float *)((long)*pauVar13 + 0xc) = fVar30 + fVar27;
            pauVar13 = pauVar13 + 1;
          }
          fVar31 = fVar31 + fVar25;
        }
      }
      if (this->clip != 0) {
        uVar14 = (ulong)(uint)pMVar4->w;
        if (pMVar4->w < 1) {
          uVar14 = 0;
        }
        for (uVar19 = 0; uVar14 != uVar19; uVar19 = uVar19 + 1) {
          fVar25 = *(float *)((long)pvVar5 + uVar19 * 4);
          if (fVar25 <= 0.0) {
            fVar25 = 0.0;
          }
          if (1.0 <= fVar25) {
            fVar25 = 1.0;
          }
          *(float *)((long)pvVar5 + uVar19 * 4) = fVar25;
        }
        return 0;
      }
      return 0;
    }
  }
  else if (iVar23 != -0xe9) goto LAB_00406c7d;
  iVar23 = pMVar3[1].w;
LAB_00406c7d:
  if (iVar12 == -0xe9) {
    iVar12 = pMVar3[1].h;
  }
  fVar25 = this->step_width;
  fVar28 = this->step_height;
  if ((fVar25 == -233.0) &&
     (fVar25 = (float)iVar23 / (float)(int)uVar1, this->step_mmdetection == true)) {
    fVar25 = ceilf(fVar25);
  }
  if ((fVar28 == -233.0) &&
     (fVar28 = (float)iVar12 / (float)(int)uVar16, this->step_mmdetection == true)) {
    fVar28 = ceilf(fVar28);
  }
  uVar17 = (this->min_sizes).w;
  iVar2 = (this->max_sizes).w;
  uVar24 = (this->aspect_ratios).w;
  iVar15 = this->flip;
  if (this->flip != 0) {
    iVar15 = uVar24 * uVar17;
  }
  iVar15 = uVar24 * uVar17 + iVar2 + uVar17 + iVar15;
  pMVar4 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Mat::create(pMVar4,uVar1 * uVar16 * iVar15 * 4,2,4,opt->blob_allocator);
  pvVar5 = pMVar4->data;
  iVar10 = -100;
  if ((pvVar5 != (void *)0x0) && ((long)pMVar4->c * pMVar4->cstep != 0)) {
    local_70 = fVar28;
    local_6c = fVar25;
    if ((this->center_mmdetection & 1U) != 0) {
      local_70 = fVar28 + -1.0;
      local_6c = fVar25 + -1.0;
    }
    fVar33 = (float)iVar23;
    fVar34 = (float)iVar12;
    auVar38._0_8_ = CONCAT44(fVar34,fVar33);
    auVar38._8_8_ = auVar38._0_8_;
    auVar38 = rcpps(in_XMM4,auVar38);
    fVar26 = auVar38._0_4_;
    fVar29 = auVar38._4_4_;
    fVar30 = auVar38._8_4_;
    fVar31 = auVar38._12_4_;
    uVar20 = 0;
    uVar19 = 0;
    if ((int)uVar24 < 1) {
      uVar24 = uVar20;
    }
    if ((int)uVar17 < 1) {
      uVar17 = uVar20;
    }
    fVar26 = (1.0 - fVar33 * fVar26) * fVar26 + fVar26;
    fVar29 = (1.0 - fVar34 * fVar29) * fVar29 + fVar29;
    fVar30 = (1.0 - fVar33 * fVar30) * fVar30 + fVar30;
    fVar31 = (1.0 - fVar34 * fVar31) * fVar31 + fVar31;
    uVar9 = uVar1;
    if ((int)uVar1 < 1) {
      uVar9 = uVar20;
    }
    if ((int)uVar16 < 1) {
      uVar14 = 0;
    }
    for (; uVar19 != uVar14; uVar19 = uVar19 + 1) {
      pauVar13 = (undefined1 (*) [16])
                 ((long)pvVar5 + (long)(int)(iVar15 * uVar1 * 4 * (int)uVar19) * 4);
      fVar34 = local_70 * this->offset + (float)(int)uVar19 * fVar28;
      fVar33 = this->offset * local_6c;
      for (uVar16 = 0; uVar16 != uVar9; uVar16 = uVar16 + 1) {
        pvVar6 = (this->min_sizes).data;
        pvVar7 = (this->max_sizes).data;
        for (uVar11 = 0; uVar11 != uVar17; uVar11 = uVar11 + 1) {
          fVar27 = *(float *)((long)pvVar6 + uVar11 * 4);
          fVar32 = fVar27 * 0.5;
          auVar36._0_4_ = (fVar33 - fVar32) * fVar26;
          auVar36._4_4_ = (fVar34 - fVar32) * fVar29;
          auVar36._8_4_ = (fVar32 + fVar33) * fVar30;
          auVar36._12_4_ = (fVar32 + fVar34) * fVar31;
          *pauVar13 = auVar36;
          if (iVar2 < 1) {
            pauVar13 = pauVar13 + 1;
          }
          else {
            fVar27 = SQRT(fVar27 * *(float *)((long)pvVar7 + uVar11 * 4)) * 0.5;
            auVar36._0_4_ = fVar33 - fVar27;
            auVar36._4_4_ = fVar34 - fVar27;
            auVar36._8_4_ = fVar33 - fVar27;
            auVar36._12_4_ = fVar34 - fVar27;
            *(float *)pauVar13[1] = auVar36._0_4_ * fVar26;
            *(float *)(pauVar13[1] + 4) = auVar36._4_4_ * fVar29;
            *(float *)(pauVar13[1] + 8) = (fVar27 + fVar33) * fVar30;
            *(float *)(pauVar13[1] + 0xc) = (fVar27 + fVar34) * fVar31;
            pauVar13 = pauVar13 + 2;
          }
          pvVar8 = (this->aspect_ratios).data;
          iVar12 = this->flip;
          for (uVar21 = 0; uVar24 != uVar21; uVar21 = uVar21 + 1) {
            fVar27 = *(float *)((long)pvVar8 + uVar21 * 4);
            auVar38 = rsqrtss(auVar36,ZEXT416((uint)fVar27));
            fVar35 = auVar38._0_4_;
            fVar37 = fVar27 * fVar35 * fVar35 + -3.0;
            auVar36._4_12_ = auVar38._4_12_;
            fVar27 = (float)(~-(uint)(ABS(fVar27) < 1.1754944e-38) &
                            (uint)(fVar27 * fVar35 * -0.5 * fVar37)) * fVar32;
            auVar36._0_4_ = fVar35 * -0.5 * fVar32 * fVar37;
            *(float *)*pauVar13 = (fVar33 - fVar27) * fVar26;
            *(float *)((long)*pauVar13 + 4) = (fVar34 - auVar36._0_4_) * fVar29;
            *(float *)((long)*pauVar13 + 8) = (fVar33 + fVar27) * fVar30;
            *(float *)((long)*pauVar13 + 0xc) = (fVar34 + auVar36._0_4_) * fVar31;
            if (iVar12 == 0) {
              pauVar13 = pauVar13 + 1;
            }
            else {
              *(float *)pauVar13[1] = (fVar33 - auVar36._0_4_) * fVar26;
              *(float *)(pauVar13[1] + 4) = (fVar34 - fVar27) * fVar29;
              *(float *)(pauVar13[1] + 8) = (fVar33 + auVar36._0_4_) * fVar30;
              *(float *)(pauVar13[1] + 0xc) = (fVar34 + fVar27) * fVar31;
              pauVar13 = pauVar13 + 2;
            }
          }
        }
        fVar33 = fVar33 + fVar25;
      }
    }
    uVar1 = pMVar4->w;
    if (this->clip != 0) {
      uVar14 = 0;
      uVar19 = 0;
      if (0 < (int)uVar1) {
        uVar19 = (ulong)uVar1;
      }
      for (; uVar19 != uVar14; uVar14 = uVar14 + 1) {
        fVar25 = *(float *)((long)pvVar5 + uVar14 * 4);
        if (fVar25 <= 0.0) {
          fVar25 = 0.0;
        }
        if (1.0 <= fVar25) {
          fVar25 = 1.0;
        }
        *(float *)((long)pvVar5 + uVar14 * 4) = fVar25;
      }
    }
    pfVar18 = (float *)((long)pvVar5 + (long)(int)uVar1 * pMVar4->elemsize);
    uVar14 = (long)(int)uVar1 / 4 & 0xffffffff;
    iVar10 = 0;
    if ((int)((long)(int)uVar1 / 4) < 1) {
      uVar14 = 0;
    }
    while (iVar12 = (int)uVar14, uVar14 = (ulong)(iVar12 - 1), iVar12 != 0) {
      *pfVar18 = this->variances[0];
      pfVar18[1] = this->variances[1];
      pfVar18[2] = this->variances[2];
      pfVar18[3] = this->variances[3];
      pfVar18 = pfVar18 + 4;
    }
  }
  return iVar10;
}

Assistant:

int PriorBox::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int w = bottom_blobs[0].w;
    int h = bottom_blobs[0].h;

    if (bottom_blobs.size() == 1 && image_width == -233 && image_height == -233 && max_sizes.empty())
    {
        // mxnet style _contrib_MultiBoxPrior
        float step_w = step_width;
        float step_h = step_height;
        if (step_w == -233)
            step_w = 1.f / (float)w;
        if (step_h == -233)
            step_h = 1.f / (float)h;

        int num_sizes = min_sizes.w;
        int num_ratios = aspect_ratios.w;

        int num_prior = num_sizes - 1 + num_ratios;

        Mat& top_blob = top_blobs[0];
        top_blob.create(4 * w * h * num_prior, 4u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* box = (float*)top_blob + i * w * num_prior * 4;

            float center_x = offset * step_w;
            float center_y = offset * step_h + i * step_h;

            for (int j = 0; j < w; j++)
            {
                // ratio = 1, various sizes
                for (int k = 0; k < num_sizes; k++)
                {
                    float size = min_sizes[k];
                    float cw = size * h / w / 2;
                    float ch = size / 2;

                    box[0] = center_x - cw;
                    box[1] = center_y - ch;
                    box[2] = center_x + cw;
                    box[3] = center_y + ch;
                    box += 4;
                }

                // various ratios, size = min_size = size[0]
                float size = min_sizes[0];
                for (int p = 1; p < num_ratios; p++)
                {
                    float ratio = static_cast<float>(sqrt(aspect_ratios[p]));
                    float cw = size * h / w * ratio / 2;
                    float ch = size / ratio / 2;

                    box[0] = center_x - cw;
                    box[1] = center_y - ch;
                    box[2] = center_x + cw;
                    box[3] = center_y + ch;
                    box += 4;
                }

                center_x += step_w;
            }
        }

        if (clip)
        {
            float* box = top_blob;
            for (int i = 0; i < top_blob.w; i++)
            {
                box[i] = std::min(std::max(box[i], 0.f), 1.f);
            }
        }

        return 0;
    }

    int image_w = image_width;
    int image_h = image_height;
    if (image_w == -233)
        image_w = bottom_blobs[1].w;
    if (image_h == -233)
        image_h = bottom_blobs[1].h;

    float step_w = step_width;
    float step_h = step_height;
    if (step_w == -233)
    {
        step_w = (float)image_w / w;
        if (step_mmdetection)
            step_w = static_cast<float>(ceil((float)image_w / w));
    }
    if (step_h == -233)
    {
        step_h = (float)image_h / h;
        if (step_mmdetection)
            step_h = static_cast<float>(ceil((float)image_h / h));
    }

    int num_min_size = min_sizes.w;
    int num_max_size = max_sizes.w;
    int num_aspect_ratio = aspect_ratios.w;

    int num_prior = num_min_size * num_aspect_ratio + num_min_size + num_max_size;
    if (flip)
        num_prior += num_min_size * num_aspect_ratio;

    Mat& top_blob = top_blobs[0];
    top_blob.create(4 * w * h * num_prior, 2, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < h; i++)
    {
        float* box = (float*)top_blob + i * w * num_prior * 4;

        float center_x = offset * step_w;
        float center_y = offset * step_h + i * step_h;
        if (center_mmdetection)
        {
            center_x = offset * (step_w - 1);
            center_y = offset * (step_h - 1) + i * step_h;
        }

        for (int j = 0; j < w; j++)
        {
            float box_w;
            float box_h;

            for (int k = 0; k < num_min_size; k++)
            {
                float min_size = min_sizes[k];

                // min size box
                box_w = box_h = min_size;

                box[0] = (center_x - box_w * 0.5f) / image_w;
                box[1] = (center_y - box_h * 0.5f) / image_h;
                box[2] = (center_x + box_w * 0.5f) / image_w;
                box[3] = (center_y + box_h * 0.5f) / image_h;

                box += 4;

                if (num_max_size > 0)
                {
                    float max_size = max_sizes[k];

                    // max size box
                    box_w = box_h = static_cast<float>(sqrt(min_size * max_size));

                    box[0] = (center_x - box_w * 0.5f) / image_w;
                    box[1] = (center_y - box_h * 0.5f) / image_h;
                    box[2] = (center_x + box_w * 0.5f) / image_w;
                    box[3] = (center_y + box_h * 0.5f) / image_h;

                    box += 4;
                }

                // all aspect_ratios
                for (int p = 0; p < num_aspect_ratio; p++)
                {
                    float ar = aspect_ratios[p];

                    box_w = static_cast<float>(min_size * sqrt(ar));
                    box_h = static_cast<float>(min_size / sqrt(ar));

                    box[0] = (center_x - box_w * 0.5f) / image_w;
                    box[1] = (center_y - box_h * 0.5f) / image_h;
                    box[2] = (center_x + box_w * 0.5f) / image_w;
                    box[3] = (center_y + box_h * 0.5f) / image_h;

                    box += 4;

                    if (flip)
                    {
                        box[0] = (center_x - box_h * 0.5f) / image_w;
                        box[1] = (center_y - box_w * 0.5f) / image_h;
                        box[2] = (center_x + box_h * 0.5f) / image_w;
                        box[3] = (center_y + box_w * 0.5f) / image_h;

                        box += 4;
                    }
                }
            }

            center_x += step_w;
        }
    }

    if (clip)
    {
        float* box = top_blob;
        for (int i = 0; i < top_blob.w; i++)
        {
            box[i] = std::min(std::max(box[i], 0.f), 1.f);
        }
    }

    // set variance
    float* var = top_blob.row(1);
    for (int i = 0; i < top_blob.w / 4; i++)
    {
        var[0] = variances[0];
        var[1] = variances[1];
        var[2] = variances[2];
        var[3] = variances[3];

        var += 4;
    }

    return 0;
}